

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceObjectArchive::Merge(DeviceObjectArchive *this,DeviceObjectArchive *Src)

{
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *this_00;
  ResourceType _Type;
  uint uVar1;
  pointer pSVar2;
  pointer pSVar3;
  SerializedData *pSVar4;
  TPointer puVar5;
  TEnable<unsigned_int> TVar6;
  bool bVar7;
  long lVar8;
  __node_base *p_Var9;
  _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
  _Var10;
  char (*pacVar11) [14];
  uint *Idx;
  int *piVar12;
  SerializedData *this_01;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *pvVar13;
  char *in_R8;
  long lVar14;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>,_bool>
  pVar15;
  char (*in_stack_fffffffffffffe08) [3];
  Serializer<(Diligent::SerializerMode)0> Ser;
  Uint32 ShaderIndex;
  undefined4 uStack_1c4;
  char (*local_1c0) [14];
  char (*local_1b8) [14];
  IMemoryAllocator *local_1b0;
  ShaderIndexArray ShaderIndices;
  char *ResName;
  DynamicLinearAllocator DynAllocator;
  array<unsigned_int,_7UL> ShaderBaseIndices;
  string _msg;
  
  if (this->m_ContentVersion != Src->m_ContentVersion) {
    in_R8 = (char *)&Src->m_ContentVersion;
    FormatString<char[51],unsigned_int,char[6],unsigned_int,char[3]>
              (&_msg,(Diligent *)"Merging archives with different content versions (",
               (char (*) [51])&this->m_ContentVersion,(uint *)0x6c4dfa,(char (*) [6])in_R8,
               (uint *)0x668694,in_stack_fffffffffffffe08);
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  local_1b0 = GetRawAllocator();
  DynAllocator.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  DynAllocator.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  DynAllocator.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DynAllocator.m_BlockSize = 0x200;
  ShaderBaseIndices._M_elems[4] = 0;
  ShaderBaseIndices._M_elems[5] = 0;
  ShaderBaseIndices._M_elems[6] = 0;
  ShaderBaseIndices._M_elems[0] = 0;
  ShaderBaseIndices._M_elems[1] = 0;
  ShaderBaseIndices._M_elems[2] = 0;
  ShaderBaseIndices._M_elems[3] = 0;
  DynAllocator.m_pAllocator = local_1b0;
  for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
    lVar8 = (long)(this->m_DeviceShaders)._M_elems[lVar14].
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_DeviceShaders)._M_elems[lVar14].
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    ShaderBaseIndices._M_elems[lVar14] = (uint)lVar8;
    pSVar2 = (Src->m_DeviceShaders)._M_elems[lVar14].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (Src->m_DeviceShaders)._M_elems[lVar14].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar2 != pSVar3) {
      this_00 = (this->m_DeviceShaders)._M_elems + lVar14;
      std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::reserve
                (this_00,((long)pSVar3 - (long)pSVar2 >> 5) + lVar8);
      pvVar13 = (Src->m_DeviceShaders)._M_elems + lVar14;
      pSVar4 = (pvVar13->
               super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (this_01 = (pvVar13->
                     super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                     )._M_impl.super__Vector_impl_data._M_start; this_01 != pSVar4;
          this_01 = this_01 + 1) {
        SerializedData::MakeCopy((SerializedData *)&_msg,this_01,local_1b0);
        std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
        emplace_back<Diligent::SerializedData>(this_00,(SerializedData *)&_msg);
        SerializedData::~SerializedData((SerializedData *)&_msg);
      }
    }
  }
  p_Var9 = &(Src->m_NamedResources)._M_h._M_before_begin;
  do {
    do {
      while( true ) {
        p_Var9 = p_Var9->_M_nxt;
        if (p_Var9 == (__node_base *)0x0) {
          DynamicLinearAllocator::~DynamicLinearAllocator(&DynAllocator);
          return;
        }
        _Type = (ResourceType)*(size_type *)(p_Var9 + 1);
        ResName = *(char **)&((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor;
        NamedResourceKey::NamedResourceKey((NamedResourceKey *)&Ser,_Type,ResName,true);
        ResourceData::MakeCopy((ResourceData *)&_msg,(ResourceData *)(p_Var9 + 4),local_1b0);
        pVar15 = std::
                 _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::
                 _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::DeviceObjectArchive::ResourceData>
                           ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                             *)this,&Ser,(ResourceData *)&_msg);
        _Var10 = pVar15.first.
                 super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                 ._M_cur;
        ResourceData::~ResourceData((ResourceData *)&_msg);
        HashMapStringKey::Clear((HashMapStringKey *)&Ser.m_End);
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
        bVar7 = ResourceData::operator!=
                          ((ResourceData *)
                           ((long)_Var10.
                                  super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                  ._M_cur + 0x20),(ResourceData *)(p_Var9 + 4));
        if (bVar7) {
          FormatString<char[26],char_const*,char[47]>
                    (&_msg,(Diligent *)"Failed to copy resource \'",(char (*) [26])&ResName,
                     (char **)"\': resource with the same name already exists.",(char (*) [47])in_R8
                    );
          if (DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0);
          }
          std::__cxx11::string::~string((string *)&_msg);
        }
      }
    } while ((TilePipeline < _Type) || ((0x7aU >> (_Type & 0x1f) & 1) == 0));
    for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
      puVar5 = *(TPointer *)
                ((long)_Var10.
                       super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                       ._M_cur + 0x48 + lVar14 * 0x20);
      if (puVar5 != (TPointer)0x0) {
        uVar1 = ShaderBaseIndices._M_elems[lVar14];
        lVar8 = lVar14 * 0x20 +
                (long)_Var10.
                      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                      ._M_cur + 0x40;
        if (_Type == StandaloneShader) {
          _ShaderIndex = (char (*) [14])((ulong)_ShaderIndex & 0xffffffff00000000);
          Ser.m_End = puVar5 + *(long *)(lVar8 + 0x10);
          Ser.m_Start = puVar5;
          Ser.m_Ptr = puVar5;
          TVar6 = Serializer<(Diligent::SerializerMode)0>::Serialize<unsigned_int>
                            (&Ser,&ShaderIndex);
          if (!TVar6) {
            in_R8 = 
            "Failed to deserialize standalone shader index. Archive file may be corrupted or invalid."
            ;
            LogError<true,char[89]>
                      (false,"Merge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                       ,0x271,(char (*) [89])
                              "Failed to deserialize standalone shader index. Archive file may be corrupted or invalid."
                      );
          }
          if (Ser.m_Ptr != Ser.m_End) {
            FormatString<char[51]>
                      (&_msg,(char (*) [51])"No other data besides the shader index is expected");
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"Merge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                       ,0x272);
            std::__cxx11::string::~string((string *)&_msg);
          }
          _ShaderIndex = (char (*) [14])CONCAT44(uStack_1c4,ShaderIndex + uVar1);
          Ser.m_Start = *(TPointer *)(lVar8 + 8);
          pacVar11 = (char (*) [14])(Ser.m_Start + *(long *)(lVar8 + 0x10));
          Ser.m_End = (TPointer)pacVar11;
          Ser.m_Ptr = Ser.m_Start;
          Serializer<(Diligent::SerializerMode)1>::Serialize<unsigned_int>
                    ((Serializer<(Diligent::SerializerMode)1> *)&Ser,&ShaderIndex);
          if (Ser.m_Ptr != Ser.m_End) {
            FormatString<char[26],char[14]>
                      (&_msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x65cec2,
                       pacVar11);
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"Merge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                       ,0x27a);
LAB_0040294d:
            std::__cxx11::string::~string((string *)&_msg);
          }
        }
        else {
          if (3 < _Type - GraphicsPipeline) {
            FormatString<char[25]>(&_msg,(char (*) [25])"Unexpected resource type");
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"Merge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                       ,0x294);
            goto LAB_0040294d;
          }
          ShaderIndices.pIndices = (Uint32 *)0x0;
          ShaderIndices.Count = 0;
          Ser.m_End = puVar5 + *(long *)(lVar8 + 0x10);
          Ser.m_Start = puVar5;
          Ser.m_Ptr = puVar5;
          bVar7 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeShaderIndices
                            (&Ser,&ShaderIndices,&DynAllocator);
          if (!bVar7) {
            in_R8 = 
            "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.";
            LogError<true,char[84]>
                      (false,"Merge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                       ,0x284,(char (*) [84])
                              "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                      );
          }
          if (Ser.m_Ptr != Ser.m_End) {
            FormatString<char[49]>
                      (&_msg,(char (*) [49])"No other data besides shader indices is expected");
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"Merge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                       ,0x285);
            std::__cxx11::string::~string((string *)&_msg);
          }
          std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&Ser,
                     ShaderIndices.pIndices,ShaderIndices.pIndices + ShaderIndices.Count,
                     (allocator_type *)&_msg);
          for (piVar12 = (int *)Ser.m_Start; piVar12 != (int *)Ser.m_End; piVar12 = piVar12 + 1) {
            *piVar12 = *piVar12 + uVar1;
          }
          pacVar11 = *(char (**) [14])(lVar8 + 8);
          local_1c0 = (char (*) [14])((long)*pacVar11 + *(long *)(lVar8 + 0x10));
          _msg._M_dataplus._M_p = (pointer)Ser.m_Start;
          _msg._M_string_length._0_4_ = ShaderIndices.Count;
          _ShaderIndex = pacVar11;
          local_1b8 = pacVar11;
          PSOSerializer<(Diligent::SerializerMode)1>::SerializeShaderIndices
                    ((Serializer<(Diligent::SerializerMode)1> *)&ShaderIndex,
                     (ConstQual<ShaderIndexArray> *)&_msg,(DynamicLinearAllocator *)0x0);
          if (local_1b8 != local_1c0) {
            FormatString<char[26],char[14]>
                      (&_msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x65cec2,
                       pacVar11);
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"Merge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                       ,0x28f);
            std::__cxx11::string::~string((string *)&_msg);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&Ser);
        }
      }
    }
  } while( true );
}

Assistant:

void DeviceObjectArchive::Merge(const DeviceObjectArchive& Src) noexcept(false)
{
    if (m_ContentVersion != Src.m_ContentVersion)
        LOG_WARNING_MESSAGE("Merging archives with different content versions (", m_ContentVersion, " and ", Src.m_ContentVersion, ").");

    static_assert(static_cast<size_t>(ResourceType::Count) == 8, "Did you add a new resource type? You may need to handle it here.");

    auto&                  Allocator = GetRawAllocator();
    DynamicLinearAllocator DynAllocator{Allocator, 512};

    // Copy shaders
    std::array<Uint32, static_cast<size_t>(DeviceType::Count)> ShaderBaseIndices{};
    for (size_t i = 0; i < m_DeviceShaders.size(); ++i)
    {
        const auto& SrcShaders = Src.m_DeviceShaders[i];
        auto&       DstShaders = m_DeviceShaders[i];
        ShaderBaseIndices[i]   = static_cast<Uint32>(DstShaders.size());
        if (SrcShaders.empty())
            continue;
        DstShaders.reserve(DstShaders.size() + SrcShaders.size());
        for (const auto& SrcShader : SrcShaders)
            DstShaders.emplace_back(SrcShader.MakeCopy(Allocator));
    }

    // Copy named resources
    for (auto& src_res_it : Src.m_NamedResources)
    {
        const auto  ResType = src_res_it.first.GetType();
        const auto* ResName = src_res_it.first.GetName();

        auto it_inserted = m_NamedResources.emplace(NamedResourceKey{ResType, ResName, /*CopyName = */ true}, src_res_it.second.MakeCopy(Allocator));
        if (!it_inserted.second)
        {
            // Silently skip duplicate resources
            if (it_inserted.first->second != src_res_it.second)
                LOG_WARNING_MESSAGE("Failed to copy resource '", ResName, "': resource with the same name already exists.");

            continue;
        }

        const auto IsStandaloneShader = (ResType == ResourceType::StandaloneShader);
        const auto IsPipeline =
            (ResType == ResourceType::GraphicsPipeline ||
             ResType == ResourceType::ComputePipeline ||
             ResType == ResourceType::RayTracingPipeline ||
             ResType == ResourceType::TilePipeline);

        // Update shader indices
        if (IsStandaloneShader || IsPipeline)
        {
            for (size_t i = 0; i < static_cast<size_t>(DeviceType::Count); ++i)
            {
                const auto BaseIdx = ShaderBaseIndices[i];

                auto& DeviceData = it_inserted.first->second.DeviceSpecific[i];
                if (!DeviceData)
                    continue;

                if (IsStandaloneShader)
                {
                    // For shaders, device-specific data is the serialized shader bytecode index
                    Uint32 ShaderIndex = 0;
                    {
                        Serializer<SerializerMode::Read> Ser{DeviceData};
                        if (!Ser(ShaderIndex))
                            LOG_ERROR_AND_THROW("Failed to deserialize standalone shader index. Archive file may be corrupted or invalid.");
                        VERIFY(Ser.IsEnded(), "No other data besides the shader index is expected");
                    }

                    ShaderIndex += BaseIdx;

                    {
                        Serializer<SerializerMode::Write> Ser{DeviceData};
                        Ser(ShaderIndex);
                        VERIFY_EXPR(Ser.IsEnded());
                    }
                }
                else if (IsPipeline)
                {
                    // For pipelines, device-specific data is the shader index array
                    ShaderIndexArray ShaderIndices;
                    {
                        Serializer<SerializerMode::Read> Ser{DeviceData};
                        if (!PSOSerializer<SerializerMode::Read>::SerializeShaderIndices(Ser, ShaderIndices, &DynAllocator))
                            LOG_ERROR_AND_THROW("Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.");
                        VERIFY(Ser.IsEnded(), "No other data besides shader indices is expected");
                    }

                    std::vector<Uint32> NewIndices{ShaderIndices.pIndices, ShaderIndices.pIndices + ShaderIndices.Count};
                    for (auto& Idx : NewIndices)
                        Idx += BaseIdx;

                    {
                        Serializer<SerializerMode::Write> Ser{DeviceData};
                        PSOSerializer<SerializerMode::Write>::SerializeShaderIndices(Ser, ShaderIndexArray{NewIndices.data(), ShaderIndices.Count}, nullptr);
                        VERIFY_EXPR(Ser.IsEnded());
                    }
                }
                else
                {
                    UNEXPECTED("Unexpected resource type");
                }
            }
        }
    }
}